

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O0

char * __thiscall
btStridingMeshInterface::serialize
          (btStridingMeshInterface *this,void *dataBuffer,btSerializer *serializer)

{
  long lVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined2 *puVar4;
  undefined1 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  long *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  double *graphicsbase_1;
  int i_1;
  btVector3DoubleData *tmpVertices_1;
  btChunk *chunk_5;
  int i;
  btVector3FloatData *tmpVertices;
  btChunk *chunk_4;
  float *graphicsbase;
  uchar *tri_indices_2;
  btCharIndexTripletData *tmpIndices_2;
  btChunk *chunk_3;
  unsigned_short *tri_indices_1;
  btShortIntIndexTripletData *tmpIndices_1;
  btChunk *chunk_2;
  uint *tri_indices;
  btIntIndexData *tmpIndices;
  btChunk *chunk_1;
  int numindices;
  int gfxindex;
  int numtriangles;
  int numverts;
  int stride;
  PHY_ScalarType gfxindextype;
  PHY_ScalarType type;
  int indexstride;
  uchar *indexbase;
  uchar *vertexbase;
  int graphicssubparts;
  int part;
  btMeshPartData *memPtr;
  btChunk *chunk;
  btStridingMeshInterfaceData *trimeshData;
  int local_e4;
  int local_cc;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  int local_38;
  int local_34;
  undefined8 *local_30;
  long local_28;
  undefined8 *local_20;
  long *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  uVar2 = (**(code **)(*in_RDI + 0x38))();
  *(undefined4 *)(local_20 + 3) = uVar2;
  *local_20 = 0;
  if (*(int *)(local_20 + 3) != 0) {
    local_28 = (**(code **)(*local_18 + 0x20))(local_18,0x38,*(undefined4 *)(local_20 + 3));
    local_30 = *(undefined8 **)(local_28 + 8);
    uVar3 = (**(code **)(*local_18 + 0x38))(local_18,local_30);
    *local_20 = uVar3;
    local_38 = (**(code **)(*in_RDI + 0x38))();
    for (local_34 = 0; local_34 < local_38; local_34 = local_34 + 1) {
      (**(code **)(*in_RDI + 0x20))
                (in_RDI,&local_40,&local_5c,&local_50,&local_58,&local_48,&local_4c,&local_60,
                 &local_54,local_34);
      *(int *)(local_30 + 6) = local_60;
      *(int *)((long)local_30 + 0x34) = local_5c;
      local_30[5] = 0;
      local_30[2] = 0;
      local_30[3] = 0;
      local_30[4] = 0;
      *local_30 = 0;
      local_30[1] = 0;
      if (local_54 == 2) {
        if (local_60 * 3 != 0) {
          lVar7 = (**(code **)(*local_18 + 0x20))(local_18,4,local_60 * 3);
          lVar1 = *(long *)(lVar7 + 8);
          uVar3 = (**(code **)(*local_18 + 0x38))(local_18,lVar1);
          local_30[2] = uVar3;
          for (local_64 = 0; local_64 < local_60; local_64 = local_64 + 1) {
            puVar6 = (undefined4 *)(local_48 + local_64 * local_4c);
            *(undefined4 *)(lVar1 + (long)(local_64 * 3) * 4) = *puVar6;
            *(undefined4 *)(lVar1 + (long)(local_64 * 3 + 1) * 4) = puVar6[1];
            *(undefined4 *)(lVar1 + (long)(local_64 * 3 + 2) * 4) = puVar6[2];
          }
          (**(code **)(*local_18 + 0x28))
                    (local_18,lVar7,"btIntIndexData",0x59415241,*(undefined8 *)(lVar7 + 8));
        }
      }
      else if (local_54 == 3) {
        if (local_60 != 0) {
          lVar7 = (**(code **)(*local_18 + 0x20))(local_18,8,local_60);
          lVar1 = *(long *)(lVar7 + 8);
          uVar3 = (**(code **)(*local_18 + 0x38))(local_18,lVar1);
          local_30[3] = uVar3;
          for (local_64 = 0; local_64 < local_60; local_64 = local_64 + 1) {
            puVar4 = (undefined2 *)(local_48 + local_64 * local_4c);
            *(undefined2 *)(lVar1 + (long)local_64 * 8) = *puVar4;
            *(undefined2 *)(lVar1 + 2 + (long)local_64 * 8) = puVar4[1];
            *(undefined2 *)(lVar1 + 4 + (long)local_64 * 8) = puVar4[2];
          }
          (**(code **)(*local_18 + 0x28))
                    (local_18,lVar7,"btShortIntIndexTripletData",0x59415241,
                     *(undefined8 *)(lVar7 + 8));
        }
      }
      else if ((local_54 == 5) && (local_60 != 0)) {
        lVar7 = (**(code **)(*local_18 + 0x20))(local_18,4,local_60);
        lVar1 = *(long *)(lVar7 + 8);
        uVar3 = (**(code **)(*local_18 + 0x38))(local_18,lVar1);
        local_30[4] = uVar3;
        for (local_64 = 0; local_64 < local_60; local_64 = local_64 + 1) {
          puVar5 = (undefined1 *)(local_48 + local_64 * local_4c);
          *(undefined1 *)(lVar1 + (long)local_64 * 4) = *puVar5;
          *(undefined1 *)(lVar1 + 1 + (long)local_64 * 4) = puVar5[1];
          *(undefined1 *)(lVar1 + 2 + (long)local_64 * 4) = puVar5[2];
        }
        (**(code **)(*local_18 + 0x28))
                  (local_18,lVar7,"btCharIndexTripletData",0x59415241,*(undefined8 *)(lVar7 + 8));
      }
      if (local_50 == 0) {
        if (local_5c != 0) {
          lVar7 = (**(code **)(*local_18 + 0x20))(local_18,0x10,local_5c);
          lVar1 = *(long *)(lVar7 + 8);
          uVar3 = (**(code **)(*local_18 + 0x38))(local_18,lVar1);
          *local_30 = uVar3;
          for (local_cc = 0; local_cc < local_5c; local_cc = local_cc + 1) {
            puVar6 = (undefined4 *)(local_40 + local_cc * local_58);
            *(undefined4 *)(lVar1 + (long)local_cc * 0x10) = *puVar6;
            *(undefined4 *)(lVar1 + (long)local_cc * 0x10 + 4) = puVar6[1];
            *(undefined4 *)(lVar1 + (long)local_cc * 0x10 + 8) = puVar6[2];
          }
          (**(code **)(*local_18 + 0x28))
                    (local_18,lVar7,"btVector3FloatData",0x59415241,*(undefined8 *)(lVar7 + 8));
        }
      }
      else if ((local_50 == 1) && (local_5c != 0)) {
        lVar7 = (**(code **)(*local_18 + 0x20))(local_18,0x20,local_5c);
        lVar1 = *(long *)(lVar7 + 8);
        uVar3 = (**(code **)(*local_18 + 0x38))(local_18,lVar1);
        local_30[1] = uVar3;
        for (local_e4 = 0; local_e4 < local_5c; local_e4 = local_e4 + 1) {
          puVar8 = (undefined8 *)(local_40 + local_e4 * local_58);
          *(undefined8 *)(lVar1 + (long)local_e4 * 0x20) = *puVar8;
          *(undefined8 *)(lVar1 + (long)local_e4 * 0x20 + 8) = puVar8[1];
          *(undefined8 *)(lVar1 + (long)local_e4 * 0x20 + 0x10) = puVar8[2];
        }
        (**(code **)(*local_18 + 0x28))
                  (local_18,lVar7,"btVector3DoubleData",0x59415241,*(undefined8 *)(lVar7 + 8));
      }
      (**(code **)(*in_RDI + 0x30))(in_RDI,local_34);
      local_30 = local_30 + 7;
    }
    (**(code **)(*local_18 + 0x28))
              (local_18,local_28,"btMeshPartData",0x59415241,*(undefined8 *)(local_28 + 8));
  }
  btVector3::serializeFloat((btVector3 *)(in_RDI + 1),(btVector3FloatData *)(local_20 + 1));
  return "btStridingMeshInterfaceData";
}

Assistant:

const char*	btStridingMeshInterface::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btStridingMeshInterfaceData* trimeshData = (btStridingMeshInterfaceData*) dataBuffer;

	trimeshData->m_numMeshParts = getNumSubParts();

	//void* uniquePtr = 0;

	trimeshData->m_meshPartsPtr = 0;

	if (trimeshData->m_numMeshParts)
	{
		btChunk* chunk = serializer->allocate(sizeof(btMeshPartData),trimeshData->m_numMeshParts);
		btMeshPartData* memPtr = (btMeshPartData*)chunk->m_oldPtr;
		trimeshData->m_meshPartsPtr = (btMeshPartData *)serializer->getUniquePointer(memPtr);


	//	int numtotalphysicsverts = 0;
		int part,graphicssubparts = getNumSubParts();
		const unsigned char * vertexbase;
		const unsigned char * indexbase;
		int indexstride;
		PHY_ScalarType type;
		PHY_ScalarType gfxindextype;
		int stride,numverts,numtriangles;
		int gfxindex;
	//	btVector3 triangle[3];

	//	btVector3 meshScaling = getScaling();

		///if the number of parts is big, the performance might drop due to the innerloop switch on indextype
		for (part=0;part<graphicssubparts ;part++,memPtr++)
		{
			getLockedReadOnlyVertexIndexBase(&vertexbase,numverts,type,stride,&indexbase,indexstride,numtriangles,gfxindextype,part);
			memPtr->m_numTriangles = numtriangles;//indices = 3*numtriangles
			memPtr->m_numVertices = numverts;
			memPtr->m_indices16 = 0;
			memPtr->m_indices32 = 0;
			memPtr->m_3indices16 = 0;
			memPtr->m_3indices8 = 0;
			memPtr->m_vertices3f = 0;
			memPtr->m_vertices3d = 0;


			switch (gfxindextype)
			{
			case PHY_INTEGER:
				{
					int numindices = numtriangles*3;
				
					if (numindices)
					{
						btChunk* chunk = serializer->allocate(sizeof(btIntIndexData),numindices);
						btIntIndexData* tmpIndices = (btIntIndexData*)chunk->m_oldPtr;
						memPtr->m_indices32 = (btIntIndexData*)serializer->getUniquePointer(tmpIndices);
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
							tmpIndices[gfxindex*3].m_value = tri_indices[0];
							tmpIndices[gfxindex*3+1].m_value = tri_indices[1];
							tmpIndices[gfxindex*3+2].m_value = tri_indices[2];
						}
						serializer->finalizeChunk(chunk,"btIntIndexData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}
			case PHY_SHORT:
				{
					if (numtriangles)
					{
						btChunk* chunk = serializer->allocate(sizeof(btShortIntIndexTripletData),numtriangles);
						btShortIntIndexTripletData* tmpIndices = (btShortIntIndexTripletData*)chunk->m_oldPtr;
						memPtr->m_3indices16 = (btShortIntIndexTripletData*) serializer->getUniquePointer(tmpIndices);
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
							tmpIndices[gfxindex].m_values[0] = tri_indices[0];
							tmpIndices[gfxindex].m_values[1] = tri_indices[1];
							tmpIndices[gfxindex].m_values[2] = tri_indices[2];
						}
						serializer->finalizeChunk(chunk,"btShortIntIndexTripletData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}
				case PHY_UCHAR:
				{
					if (numtriangles)
					{
						btChunk* chunk = serializer->allocate(sizeof(btCharIndexTripletData),numtriangles);
						btCharIndexTripletData* tmpIndices = (btCharIndexTripletData*)chunk->m_oldPtr;
						memPtr->m_3indices8 = (btCharIndexTripletData*) serializer->getUniquePointer(tmpIndices);
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
							tmpIndices[gfxindex].m_values[0] = tri_indices[0];
							tmpIndices[gfxindex].m_values[1] = tri_indices[1];
							tmpIndices[gfxindex].m_values[2] = tri_indices[2];
						}
						serializer->finalizeChunk(chunk,"btCharIndexTripletData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}
			default:
				{
					btAssert(0);
					//unknown index type
				}
			}

			switch (type)
			{
			case PHY_FLOAT:
			 {
				 float* graphicsbase;

				 if (numverts)
				 {
					 btChunk* chunk = serializer->allocate(sizeof(btVector3FloatData),numverts);
					 btVector3FloatData* tmpVertices = (btVector3FloatData*) chunk->m_oldPtr;
					 memPtr->m_vertices3f = (btVector3FloatData *)serializer->getUniquePointer(tmpVertices);
					 for (int i=0;i<numverts;i++)
					 {
						 graphicsbase = (float*)(vertexbase+i*stride);
						 tmpVertices[i].m_floats[0] = graphicsbase[0];
						 tmpVertices[i].m_floats[1] = graphicsbase[1];
						 tmpVertices[i].m_floats[2] = graphicsbase[2];
					 }
					 serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
				 }
				 break;
				}

			case PHY_DOUBLE:
				{
					if (numverts)
					{
						btChunk* chunk = serializer->allocate(sizeof(btVector3DoubleData),numverts);
						btVector3DoubleData* tmpVertices = (btVector3DoubleData*) chunk->m_oldPtr;
						memPtr->m_vertices3d = (btVector3DoubleData *) serializer->getUniquePointer(tmpVertices);
						for (int i=0;i<numverts;i++)
					 {
						 double* graphicsbase = (double*)(vertexbase+i*stride);//for now convert to float, might leave it at double
						 tmpVertices[i].m_floats[0] = graphicsbase[0];
						 tmpVertices[i].m_floats[1] = graphicsbase[1];
						 tmpVertices[i].m_floats[2] = graphicsbase[2];
					 }
						serializer->finalizeChunk(chunk,"btVector3DoubleData",BT_ARRAY_CODE,(void*)chunk->m_oldPtr);
					}
					break;
				}

			default:
				btAssert((type == PHY_FLOAT) || (type == PHY_DOUBLE));
			}

			unLockReadOnlyVertexBase(part);
		}

		serializer->finalizeChunk(chunk,"btMeshPartData",BT_ARRAY_CODE,chunk->m_oldPtr);
	}


	m_scaling.serializeFloat(trimeshData->m_scaling);
	return "btStridingMeshInterfaceData";
}